

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void handle_ssi_request(mg_connection *nc,char *path,mg_serve_http_opts *opts)

{
  int sock;
  FILE *__stream;
  mg_str mVar1;
  ulong local_40;
  mg_str mime_type;
  FILE *fp;
  mg_serve_http_opts *opts_local;
  char *path_local;
  mg_connection *nc_local;
  
  __stream = fopen64(path,"rb");
  if (__stream == (FILE *)0x0) {
    send_http_error(nc,0x194,"Not Found");
  }
  else {
    sock = fileno(__stream);
    mg_set_close_on_exec(sock);
    mVar1 = get_mime_type(path,"text/plain",opts);
    local_40 = mVar1.len;
    mg_send_response_line(nc,200,opts->extra_headers);
    mg_printf(nc,"Content-Type: %.*s\r\nConnection: close\r\n\r\n",local_40 & 0xffffffff);
    send_ssi_file(nc,path,(FILE *)__stream,0,opts);
    fclose(__stream);
    nc->flags = nc->flags | 0x400;
  }
  return;
}

Assistant:

static void handle_ssi_request(struct mg_connection *nc, const char *path,
                               const struct mg_serve_http_opts *opts) {
    FILE *fp;
    struct mg_str mime_type;

    if ((fp = fopen(path, "rb")) == NULL) {
        send_http_error(nc, 404, "Not Found");
    } else {
        mg_set_close_on_exec(fileno(fp));

        mime_type = get_mime_type(path, "text/plain", opts);
        mg_send_response_line(nc, 200, opts->extra_headers);
        mg_printf(nc,
                  "Content-Type: %.*s\r\n"
                          "Connection: close\r\n\r\n",
                  (int) mime_type.len, mime_type.p);
        send_ssi_file(nc, path, fp, 0, opts);
        fclose(fp);
        nc->flags |= MG_F_SEND_AND_CLOSE;
    }
}